

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCharacterDataImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMCharacterDataImpl::replaceData
          (DOMCharacterDataImpl *this,DOMNode *node,XMLSize_t offset,XMLSize_t count,XMLCh *dat)

{
  DOMNodeImpl *pDVar1;
  DOMException *this_00;
  MemoryManager **ppMVar2;
  
  pDVar1 = castToNodeImpl(node);
  if ((pDVar1->flags & 1) == 0) {
    deleteData(this,node,offset,count);
    insertData(this,node,offset,dat);
    return;
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  if (this->fDoc == (DOMDocumentImpl *)0x0) {
    ppMVar2 = (MemoryManager **)&XMLPlatformUtils::fgMemoryManager;
  }
  else {
    ppMVar2 = &this->fDoc->fMemoryManager;
  }
  DOMException::DOMException(this_00,7,0,*ppMVar2);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMCharacterDataImpl::replaceData(const DOMNode *node, XMLSize_t offset, XMLSize_t count,
                                    const XMLCh *dat)
{
    if (castToNodeImpl(node)->isReadOnly())
        throw DOMException(
        DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMCharacterDataImplMemoryManager);

    deleteData(node, offset, count);
    insertData(node, offset, dat);
}